

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

uint Js::JavascriptOperators::GetLiteralInlineSlotCapacity(PropertyIdArray *propIds)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  if (propIds->hadDuplicates == false) {
    bVar1 = FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
    uVar3 = propIds->count;
    if (bVar1) {
      uVar2 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity((PropertyIndex)uVar3)
      ;
    }
    else {
      uVar4 = 0x10;
      if (uVar3 < 0x10) {
        uVar4 = uVar3;
      }
      uVar2 = DynamicTypeHandler::RoundUpInlineSlotCapacity((PropertyIndex)uVar4);
    }
    uVar3 = (uint)uVar2;
  }
  return uVar3;
}

Assistant:

uint JavascriptOperators::GetLiteralInlineSlotCapacity(
        Js::PropertyIdArray const * propIds)
    {
        if (propIds->hadDuplicates)
        {
            return 0;
        }

        return
            FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds)
                ?   DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(static_cast<PropertyIndex>(propIds->count))
                :   DynamicTypeHandler::RoundUpInlineSlotCapacity(
                        static_cast<PropertyIndex>(
                            min(propIds->count, static_cast<uint32>(MaxPreInitializedObjectTypeInlineSlotCount))));
    }